

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

TRef lj_opt_fwd_alen(jit_State *J)

{
  ushort uVar1;
  uint ta;
  int iVar2;
  AliasRet AVar3;
  TRef TVar4;
  IRIns *pIVar5;
  IRIns *pIVar6;
  IRIns *pIVar7;
  IRIns *idx;
  IRIns *fref;
  IRIns *aref;
  IRIns *store_1;
  IRRef sref;
  IRIns *key;
  IRIns *href;
  IRIns *store;
  uint local_20;
  IRRef ref;
  IRRef lim;
  IRRef tab;
  jit_State *J_local;
  
  ta = (uint)(J->fold).ins.field_0.op1;
  uVar1 = J->chain[0x4b];
  while (store._4_4_ = (uint)uVar1, local_20 = ta, ta < store._4_4_) {
    pIVar5 = (J->cur).ir + store._4_4_;
    pIVar6 = (J->cur).ir + (&((J->cur).ir)->field_0)[(pIVar5->field_0).op1].op2;
    if ((pIVar6->field_1).o == '\x1e') {
      store_1._7_1_ = *(byte *)((long)(J->cur).ir + (ulong)(pIVar6->field_0).op1 * 8 + 4);
    }
    else {
      store_1._7_1_ = (pIVar6->field_1).t.irt;
    }
    if ((store_1._7_1_ & 0x1f) == 0xe) {
      local_20 = store._4_4_;
      break;
    }
    uVar1 = (pIVar5->field_0).prev;
  }
  uVar1 = J->chain[0x49];
  while (store._4_4_ = (uint)uVar1, local_20 < store._4_4_) {
    if ((J->cur).ir[store._4_4_].field_0.op1 == ta) {
      iVar2 = fwd_aa_tab_clear(J,store._4_4_,ta);
      if (iVar2 != 0) {
        uVar1 = J->chain[0x4a];
        goto LAB_00141441;
      }
      break;
    }
    uVar1 = *(ushort *)((long)(J->cur).ir + (ulong)store._4_4_ * 8 + 6);
  }
LAB_00141580:
  TVar4 = lj_ir_emit(J);
  return TVar4;
LAB_00141441:
  store_1._0_4_ = (uint)uVar1;
  if ((uint)store_1 <= store._4_4_) {
    return store._4_4_;
  }
  pIVar5 = (J->cur).ir + (uint)store_1;
  pIVar6 = (J->cur).ir + (pIVar5->field_0).op1;
  pIVar7 = (J->cur).ir + (pIVar6->field_0).op1;
  if (ta == (pIVar7->field_0).op1) {
    pIVar7 = (J->cur).ir + (pIVar6->field_0).op2;
    if ((((((pIVar5->field_1).t.irt & 0x1f) != 0) && ((pIVar7->field_1).o == ')')) &&
        ((pIVar7->field_0).op1 == store._4_4_)) &&
       ((*(char *)((long)(J->cur).ir + (ulong)(pIVar7->field_0).op2 * 8 + 5) == '\x17' &&
        ((J->cur).ir[(pIVar7->field_0).op2].field_1.op12 == 1)))) {
      (J->fold).ins.field_0.op2 = (pIVar6->field_0).op2;
    }
    goto LAB_00141580;
  }
  AVar3 = aa_table(J,ta,(uint)(pIVar7->field_0).op1);
  if (AVar3 == ALIAS_NO) goto LAB_00141580;
  uVar1 = (pIVar5->field_0).prev;
  goto LAB_00141441;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_alen(jit_State *J)
{
  IRRef tab = fins->op1;  /* Table reference. */
  IRRef lim = tab;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting HSTORE with numeric key. */
  ref = J->chain[IR_HSTORE];
  while (ref > lim) {
    IRIns *store = IR(ref);
    IRIns *href = IR(store->op1);
    IRIns *key = IR(href->op2);
    if (irt_isnum(key->o == IR_KSLOT ? IR(key->op1)->t : key->t)) {
      lim = ref;  /* Conflicting store found, limits search for ALEN. */
      break;
    }
    ref = store->prev;
  }

  /* Try to find a matching ALEN. */
  ref = J->chain[IR_ALEN];
  while (ref > lim) {
    /* CSE for ALEN only depends on the table, not the hint. */
    if (IR(ref)->op1 == tab) {
      IRRef sref;

      /* Search for aliasing table.clear. */
      if (!fwd_aa_tab_clear(J, ref, tab))
	break;

      /* Search for hint-forwarding or conflicting store. */
      sref = J->chain[IR_ASTORE];
      while (sref > ref) {
	IRIns *store = IR(sref);
	IRIns *aref = IR(store->op1);
	IRIns *fref = IR(aref->op1);
	if (tab == fref->op1) {  /* ASTORE to the same table. */
	  /* Detect t[#t+1] = x idiom for push. */
	  IRIns *idx = IR(aref->op2);
	  if (!irt_isnil(store->t) &&
	      idx->o == IR_ADD && idx->op1 == ref &&
	      IR(idx->op2)->o == IR_KINT && IR(idx->op2)->i == 1) {
	    /* Note: this requires an extra PHI check in loop unroll. */
	    fins->op2 = aref->op2;  /* Set ALEN hint. */
	  }
	  goto doemit;  /* Conflicting store, possibly giving a hint. */
	} else if (aa_table(J, tab, fref->op1) == ALIAS_NO) {
	  goto doemit;  /* Conflicting store. */
	}
	sref = store->prev;
      }

      return ref;  /* Plain ALEN forwarding. */
    }
    ref = IR(ref)->prev;
  }
doemit:
  return EMITFOLD;
}